

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

EnclosingExpr * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::EnclosingExpr,char_const(&)[10],(anonymous_namespace)::Node*&,char_const(&)[2]>
          (Db *this,char (*args) [10],Node **args_1,char (*args_2) [2])

{
  Node *pNVar1;
  EnclosingExpr *pEVar2;
  size_t sVar3;
  
  pEVar2 = (EnclosingExpr *)
           anon_unknown.dwarf_448ecb::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x38);
  sVar3 = strlen(*args);
  pNVar1 = *args_1;
  (pEVar2->super_Expr).super_Node.K = KExpr;
  (pEVar2->super_Expr).super_Node.RHSComponentCache = No;
  (pEVar2->super_Expr).super_Node.ArrayCache = No;
  (pEVar2->super_Expr).super_Node.FunctionCache = No;
  (pEVar2->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00208128;
  (pEVar2->Prefix).First = *args;
  (pEVar2->Prefix).Last = *args + sVar3;
  pEVar2->Infix = pNVar1;
  (pEVar2->Postfix).First = ")";
  (pEVar2->Postfix).Last = "";
  return pEVar2;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }